

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise_x86::forward
          (Eltwise_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  uint uVar2;
  Mat *m;
  Mat *this_00;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ulong uVar9;
  uint uVar10;
  float *pfVar11;
  pointer pMVar12;
  float *pfVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  float *pfVar16;
  undefined1 (*pauVar17) [16];
  int iVar18;
  undefined1 (*pauVar19) [16];
  uint uVar20;
  long lVar21;
  ulong uVar22;
  float fVar23;
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar2 = m->c;
  uVar22 = (ulong)uVar2;
  uVar10 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar18 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if ((this->super_Eltwise).op_type == 0) {
      if (0 < (int)uVar2) {
        pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          pfVar11 = (float *)(m->cstep * uVar9 * m->elemsize + (long)m->data);
          pfVar13 = (float *)(pMVar12[1].cstep * uVar9 * pMVar12[1].elemsize + (long)pMVar12[1].data
                             );
          pauVar15 = (undefined1 (*) [16])
                     (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar10 < 4) {
            uVar20 = 0;
          }
          else {
            iVar18 = 3;
            do {
              auVar27._0_4_ = *pfVar13 * *pfVar11;
              auVar27._4_4_ = pfVar13[1] * pfVar11[1];
              auVar27._8_4_ = pfVar13[2] * pfVar11[2];
              auVar27._12_4_ = pfVar13[3] * pfVar11[3];
              *pauVar15 = auVar27;
              pfVar11 = pfVar11 + 4;
              pfVar13 = pfVar13 + 4;
              pauVar15 = pauVar15 + 1;
              iVar18 = iVar18 + 4;
              uVar20 = uVar10 & 0xfffffffc;
            } while (iVar18 < (int)uVar10);
          }
          if (uVar10 - uVar20 != 0 && (int)uVar20 <= (int)uVar10) {
            lVar21 = 0;
            do {
              *(float *)((long)*pauVar15 + lVar21 * 4) = pfVar13[lVar21] * pfVar11[lVar21];
              lVar21 = lVar21 + 1;
            } while (uVar10 - uVar20 != (int)lVar21);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar22);
      }
      pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar12 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar9 = 2;
        do {
          if (0 < (int)uVar2) {
            pMVar12 = pMVar12 + uVar9;
            uVar14 = 0;
            do {
              pfVar11 = (float *)(pMVar12->cstep * uVar14 * pMVar12->elemsize + (long)pMVar12->data)
              ;
              pauVar15 = (undefined1 (*) [16])
                         (this_00->cstep * uVar14 * this_00->elemsize + (long)this_00->data);
              uVar20 = 0;
              if (3 < (int)uVar10) {
                iVar18 = 3;
                do {
                  auVar24._0_4_ = *pfVar11 * *(float *)*pauVar15;
                  auVar24._4_4_ = pfVar11[1] * *(float *)((long)*pauVar15 + 4);
                  auVar24._8_4_ = pfVar11[2] * *(float *)((long)*pauVar15 + 8);
                  auVar24._12_4_ = pfVar11[3] * *(float *)((long)*pauVar15 + 0xc);
                  *pauVar15 = auVar24;
                  pfVar11 = pfVar11 + 4;
                  pauVar15 = pauVar15 + 1;
                  iVar18 = iVar18 + 4;
                  uVar20 = uVar10 & 0xfffffffc;
                } while (iVar18 < (int)uVar10);
              }
              if (uVar10 - uVar20 != 0 && (int)uVar20 <= (int)uVar10) {
                lVar21 = 0;
                do {
                  *(float *)((long)*pauVar15 + lVar21 * 4) =
                       *(float *)((long)*pauVar15 + lVar21 * 4) * pfVar11[lVar21];
                  lVar21 = lVar21 + 1;
                } while (uVar10 - uVar20 != (int)lVar21);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar22);
          }
          uVar9 = uVar9 + 1;
          pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >>
                                 3) * -0x71c71c71c71c71c7));
      }
    }
    if ((this->super_Eltwise).op_type == 1) {
      pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->super_Eltwise).coeffs.w == 0) {
        if (0 < (int)uVar2) {
          uVar9 = 0;
          do {
            pfVar11 = (float *)(m->cstep * uVar9 * m->elemsize + (long)m->data);
            pfVar13 = (float *)(pMVar12[1].cstep * uVar9 * pMVar12[1].elemsize +
                               (long)pMVar12[1].data);
            pauVar15 = (undefined1 (*) [16])
                       (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar10 < 4) {
              uVar20 = 0;
            }
            else {
              iVar18 = 3;
              do {
                auVar25._0_4_ = *pfVar13 + *pfVar11;
                auVar25._4_4_ = pfVar13[1] + pfVar11[1];
                auVar25._8_4_ = pfVar13[2] + pfVar11[2];
                auVar25._12_4_ = pfVar13[3] + pfVar11[3];
                *pauVar15 = auVar25;
                pfVar11 = pfVar11 + 4;
                pfVar13 = pfVar13 + 4;
                pauVar15 = pauVar15 + 1;
                iVar18 = iVar18 + 4;
                uVar20 = uVar10 & 0xfffffffc;
              } while (iVar18 < (int)uVar10);
            }
            if (uVar10 - uVar20 != 0 && (int)uVar20 <= (int)uVar10) {
              lVar21 = 0;
              do {
                *(float *)((long)*pauVar15 + lVar21 * 4) = pfVar13[lVar21] + pfVar11[lVar21];
                lVar21 = lVar21 + 1;
              } while (uVar10 - uVar20 != (int)lVar21);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar22);
        }
        pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar12 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar9 = 2;
          do {
            if (0 < (int)uVar2) {
              pMVar12 = pMVar12 + uVar9;
              uVar14 = 0;
              do {
                pfVar11 = (float *)(pMVar12->cstep * uVar14 * pMVar12->elemsize +
                                   (long)pMVar12->data);
                pauVar15 = (undefined1 (*) [16])
                           (this_00->cstep * uVar14 * this_00->elemsize + (long)this_00->data);
                uVar20 = 0;
                if (3 < (int)uVar10) {
                  iVar18 = 3;
                  do {
                    auVar26._0_4_ = *pfVar11 + *(float *)*pauVar15;
                    auVar26._4_4_ = pfVar11[1] + *(float *)((long)*pauVar15 + 4);
                    auVar26._8_4_ = pfVar11[2] + *(float *)((long)*pauVar15 + 8);
                    auVar26._12_4_ = pfVar11[3] + *(float *)((long)*pauVar15 + 0xc);
                    *pauVar15 = auVar26;
                    pfVar11 = pfVar11 + 4;
                    pauVar15 = pauVar15 + 1;
                    iVar18 = iVar18 + 4;
                    uVar20 = uVar10 & 0xfffffffc;
                  } while (iVar18 < (int)uVar10);
                }
                if (uVar10 - uVar20 != 0 && (int)uVar20 <= (int)uVar10) {
                  lVar21 = 0;
                  do {
                    *(float *)((long)*pauVar15 + lVar21 * 4) =
                         *(float *)((long)*pauVar15 + lVar21 * 4) + pfVar11[lVar21];
                    lVar21 = lVar21 + 1;
                  } while (uVar10 - uVar20 != (int)lVar21);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar22);
            }
            uVar9 = uVar9 + 1;
            pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar9 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar12
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar2) {
          uVar9 = 0;
          do {
            pfVar11 = (float *)(m->cstep * uVar9 * m->elemsize + (long)m->data);
            pfVar13 = (float *)(pMVar12[1].cstep * uVar9 * pMVar12[1].elemsize +
                               (long)pMVar12[1].data);
            pfVar16 = (float *)(this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
            uVar1 = *(this->super_Eltwise).coeffs.data;
            fVar23 = (float)uVar1;
            fVar28 = (float)((ulong)uVar1 >> 0x20);
            if ((int)uVar10 < 4) {
              uVar20 = 0;
            }
            else {
              iVar18 = 3;
              do {
                fVar3 = pfVar11[1];
                fVar4 = pfVar11[2];
                fVar5 = pfVar11[3];
                fVar6 = pfVar13[1];
                fVar7 = pfVar13[2];
                fVar8 = pfVar13[3];
                *pfVar16 = *pfVar13 * fVar28 + *pfVar11 * fVar23;
                pfVar16[1] = fVar6 * fVar28 + fVar3 * fVar23;
                pfVar16[2] = fVar7 * fVar28 + fVar4 * fVar23;
                pfVar16[3] = fVar8 * fVar28 + fVar5 * fVar23;
                pfVar11 = pfVar11 + 4;
                pfVar13 = pfVar13 + 4;
                pfVar16 = pfVar16 + 4;
                iVar18 = iVar18 + 4;
                uVar20 = uVar10 & 0xfffffffc;
              } while (iVar18 < (int)uVar10);
            }
            if (uVar10 - uVar20 != 0 && (int)uVar20 <= (int)uVar10) {
              lVar21 = 0;
              do {
                pfVar16[lVar21] = pfVar13[lVar21] * fVar28 + pfVar11[lVar21] * fVar23;
                lVar21 = lVar21 + 1;
              } while (uVar10 - uVar20 != (int)lVar21);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar22);
        }
        pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar12 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar9 = 2;
          do {
            if (0 < (int)uVar2) {
              pMVar12 = pMVar12 + uVar9;
              uVar14 = 0;
              do {
                pfVar11 = (float *)(pMVar12->cstep * uVar14 * pMVar12->elemsize +
                                   (long)pMVar12->data);
                pfVar13 = (float *)(this_00->cstep * uVar14 * this_00->elemsize +
                                   (long)this_00->data);
                fVar23 = *(float *)((long)(this->super_Eltwise).coeffs.data + uVar9 * 4);
                uVar20 = 0;
                if (3 < (int)uVar10) {
                  iVar18 = 3;
                  do {
                    fVar28 = pfVar11[1];
                    fVar3 = pfVar11[2];
                    fVar4 = pfVar11[3];
                    *pfVar13 = *pfVar11 * fVar23 + *pfVar13;
                    pfVar13[1] = fVar28 * fVar23 + pfVar13[1];
                    pfVar13[2] = fVar3 * fVar23 + pfVar13[2];
                    pfVar13[3] = fVar4 * fVar23 + pfVar13[3];
                    pfVar11 = pfVar11 + 4;
                    pfVar13 = pfVar13 + 4;
                    iVar18 = iVar18 + 4;
                    uVar20 = uVar10 & 0xfffffffc;
                  } while (iVar18 < (int)uVar10);
                }
                if (uVar10 - uVar20 != 0 && (int)uVar20 <= (int)uVar10) {
                  lVar21 = 0;
                  do {
                    pfVar13[lVar21] = pfVar11[lVar21] * fVar23 + pfVar13[lVar21];
                    lVar21 = lVar21 + 1;
                  } while (uVar10 - uVar20 != (int)lVar21);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar22);
            }
            uVar9 = uVar9 + 1;
            pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar9 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar12
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar18 = 0;
    if ((this->super_Eltwise).op_type == 2) {
      if (0 < (int)uVar2) {
        pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          pauVar15 = (undefined1 (*) [16])(m->cstep * uVar9 * m->elemsize + (long)m->data);
          pauVar17 = (undefined1 (*) [16])
                     (pMVar12[1].cstep * uVar9 * pMVar12[1].elemsize + (long)pMVar12[1].data);
          pauVar19 = (undefined1 (*) [16])
                     (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar10 < 4) {
            uVar20 = 0;
          }
          else {
            iVar18 = 3;
            do {
              auVar27 = maxps(*pauVar15,*pauVar17);
              *pauVar19 = auVar27;
              pauVar15 = pauVar15 + 1;
              pauVar17 = pauVar17 + 1;
              pauVar19 = pauVar19 + 1;
              iVar18 = iVar18 + 4;
              uVar20 = uVar10 & 0xfffffffc;
            } while (iVar18 < (int)uVar10);
          }
          if (uVar10 - uVar20 != 0 && (int)uVar20 <= (int)uVar10) {
            lVar21 = 0;
            do {
              fVar23 = *(float *)(*pauVar17 + lVar21 * 4);
              if (*(float *)(*pauVar17 + lVar21 * 4) <= *(float *)(*pauVar15 + lVar21 * 4)) {
                fVar23 = *(float *)(*pauVar15 + lVar21 * 4);
              }
              *(float *)((long)*pauVar19 + lVar21 * 4) = fVar23;
              lVar21 = lVar21 + 1;
            } while (uVar10 - uVar20 != (int)lVar21);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar22);
      }
      pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar18 = 0;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar12 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar9 = 2;
        do {
          if (0 < (int)uVar2) {
            pMVar12 = pMVar12 + uVar9;
            uVar14 = 0;
            do {
              pauVar15 = (undefined1 (*) [16])
                         (pMVar12->cstep * uVar14 * pMVar12->elemsize + (long)pMVar12->data);
              pauVar17 = (undefined1 (*) [16])
                         (this_00->cstep * uVar14 * this_00->elemsize + (long)this_00->data);
              uVar20 = 0;
              if (3 < (int)uVar10) {
                iVar18 = 3;
                do {
                  auVar27 = maxps(*pauVar17,*pauVar15);
                  *pauVar17 = auVar27;
                  pauVar15 = pauVar15 + 1;
                  pauVar17 = pauVar17 + 1;
                  iVar18 = iVar18 + 4;
                  uVar20 = uVar10 & 0xfffffffc;
                } while (iVar18 < (int)uVar10);
              }
              if (uVar10 - uVar20 != 0 && (int)uVar20 <= (int)uVar10) {
                lVar21 = 0;
                do {
                  fVar23 = *(float *)(*pauVar17 + lVar21 * 4);
                  if (*(float *)(*pauVar17 + lVar21 * 4) <= *(float *)(*pauVar15 + lVar21 * 4)) {
                    fVar23 = *(float *)(*pauVar15 + lVar21 * 4);
                  }
                  *(float *)(*pauVar17 + lVar21 * 4) = fVar23;
                  lVar21 = lVar21 + 1;
                } while (uVar10 - uVar20 != (int)lVar21);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar22);
          }
          uVar9 = uVar9 + 1;
          pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >>
                                 3) * -0x71c71c71c71c71c7));
        iVar18 = 0;
      }
    }
  }
  return iVar18;
}

Assistant:

int Eltwise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}